

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

Vector3d *
RigidBodyDynamics::CalcBodyToBaseCoordinates
          (Model *model,VectorNd *Q,uint body_id,Vector3d *point_body_coordinates,
          bool update_kinematics)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  uint in_ECX;
  long in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDI;
  byte in_R9B;
  Vector3d body_position;
  Matrix3d body_rotation;
  VectorNd *in_stack_00000138;
  Vector3d parent_body_position;
  Matrix3d parent_body_rotation;
  Vector3d fixed_position;
  Matrix3d fixed_rotation;
  uint parent_id;
  uint fbody_id;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>_>
  *in_stack_fffffffffffffdb8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  undefined1 in_stack_fffffffffffffdd0 [16];
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
  *in_stack_fffffffffffffde0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffde8;
  
  this = in_RDI;
  if ((in_R9B & 1) != 0) {
    UpdateKinematicsCustom
              ((Model *)parent_body_position.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2],
               (VectorNd *)
               parent_body_position.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1],(VectorNd *)
                   parent_body_position.super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0],in_stack_00000138);
  }
  if (in_ECX < *(uint *)(in_RSI + 0x300)) {
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RSI + 0x2d0),(ulong)in_ECX);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffdb8);
    Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix3_t *)this,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffdb8);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RSI + 0x2d0),(ulong)in_ECX);
    Vector3_t::Vector3_t((Vector3_t *)this,(Vector3_t *)in_stack_fffffffffffffdb8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (this,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdb8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_fffffffffffffde8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffffde0);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
              ((Vector3_t *)this,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                *)in_stack_fffffffffffffdb8);
  }
  else {
    uVar2 = in_ECX - *(int *)(in_RSI + 0x300);
    pvVar3 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x2e8),(ulong)uVar2);
    uVar1 = pvVar3->mMovableParent;
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RSI + 0x2e8),(ulong)uVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffdb8);
    Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix3_t *)this,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffdb8);
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RSI + 0x2e8),(ulong)uVar2);
    Vector3_t::Vector3_t((Vector3_t *)this,(Vector3_t *)in_stack_fffffffffffffdb8);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RSI + 0x2d0),(ulong)uVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffdb8);
    Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix3_t *)this,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffdb8);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RSI + 0x2d0),(ulong)uVar1);
    Vector3_t::Vector3_t((Vector3_t *)this,(Vector3_t *)in_stack_fffffffffffffdb8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (this,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdb8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_fffffffffffffde8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffffde0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (in_stack_fffffffffffffdd0._8_8_,in_stack_fffffffffffffdd0._0_8_);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,0>const>>
              ((Vector3_t *)this,in_stack_fffffffffffffdb8);
  }
  return (Vector3d *)in_RDI;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcBodyToBaseCoordinates (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_body_coordinates,
		bool update_kinematics) {
	// update the Kinematics if necessary
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	if (body_id >= model.fixed_body_discriminator) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		unsigned int parent_id = model.mFixedBodies[fbody_id].mMovableParent;

		Matrix3d fixed_rotation = model.mFixedBodies[fbody_id].mParentTransform.E.transpose();
		Vector3d fixed_position = model.mFixedBodies[fbody_id].mParentTransform.r;

		Matrix3d parent_body_rotation = model.X_base[parent_id].E.transpose();
		Vector3d parent_body_position = model.X_base[parent_id].r;
		return parent_body_position + parent_body_rotation * (fixed_position + fixed_rotation * (point_body_coordinates));
	}

	Matrix3d body_rotation = model.X_base[body_id].E.transpose();
	Vector3d body_position = model.X_base[body_id].r;

	return body_position + body_rotation * point_body_coordinates;
}